

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O1

void cm_zlib_gz_error(gz_statep state,int err,char *msg)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__s_00;
  
  if (state->msg != (char *)0x0) {
    if (state->err != -4) {
      free(state->msg);
    }
    state->msg = (char *)0x0;
  }
  if ((err != -5) && (err != 0)) {
    (state->x).have = 0;
  }
  state->err = err;
  if (err != -4 && msg != (char *)0x0) {
    __s = state->path;
    sVar1 = strlen(__s);
    sVar2 = strlen(msg);
    __s_00 = (char *)malloc(sVar1 + sVar2 + 3);
    state->msg = __s_00;
    if (__s_00 != (char *)0x0) {
      sVar1 = strlen(__s);
      sVar2 = strlen(msg);
      snprintf(__s_00,sVar1 + sVar2 + 3,"%s%s%s",__s,": ",msg);
      return;
    }
    state->err = -4;
  }
  return;
}

Assistant:

void ZLIB_INTERNAL gz_error(state, err, msg)
    gz_statep state;
    int err;
    const char *msg;
{
    /* free previously allocated message and clear */
    if (state->msg != NULL) {
        if (state->err != Z_MEM_ERROR)
            free(state->msg);
        state->msg = NULL;
    }

    /* if fatal, set state->x.have to 0 so that the gzgetc() macro fails */
    if (err != Z_OK && err != Z_BUF_ERROR)
        state->x.have = 0;

    /* set error code, and if no message, then done */
    state->err = err;
    if (msg == NULL)
        return;

    /* for an out of memory error, return literal string when requested */
    if (err == Z_MEM_ERROR)
        return;

    /* construct error message with path */
    if ((state->msg = (char *)malloc(strlen(state->path) + strlen(msg) + 3)) ==
            NULL) {
        state->err = Z_MEM_ERROR;
        return;
    }
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    (void)snprintf(state->msg, strlen(state->path) + strlen(msg) + 3,
                   "%s%s%s", state->path, ": ", msg);
#else
    strcpy(state->msg, state->path);
    strcat(state->msg, ": ");
    strcat(state->msg, msg);
#endif
}